

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

void signalHandler(int signum)

{
  float fVar1;
  long lVar2;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar3;
  bool bVar4;
  ostream *poVar5;
  long lVar6;
  ArgPositional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pAVar7;
  ArgFlag *pAVar8;
  ArgOption<unsigned_int> *pAVar9;
  ArgOption<float> *pAVar10;
  ArgOption<float> *pAVar11;
  long lVar12;
  uint b;
  char *pcVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  undefined4 uVar15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  allocator aStack_5ac;
  allocator aStack_5ab;
  allocator_type aStack_5aa;
  allocator_type aStack_5a9;
  string sStack_5a8;
  string sStack_588;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_550;
  ArgOption<float> *pAStack_530;
  ArgFlag *pAStack_528;
  double dStack_520;
  char **ppcStack_518;
  ArgOption<float> *pAStack_510;
  ArgFlag *pAStack_508;
  ArgFlag *pAStack_500;
  ArgFlag *pAStack_4f8;
  ArgFlag *pAStack_4f0;
  ArgFlag *pAStack_4e8;
  ArgFlag *pAStack_4e0;
  ArgFlag *pAStack_4d8;
  string asStack_4d0 [8];
  string sStack_3b8;
  string asStack_398 [488];
  ArgumentParser AStack_1b0;
  undefined8 *puStack_48;
  
  poVar5 = std::operator<<((ostream *)&std::cout,"Interrupt signal (");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,signum);
  std::operator<<(poVar5,") received.\n");
  lVar6 = std::chrono::_V2::steady_clock::now();
  lVar6 = lVar6 - (long)start.__d.__r;
  poVar5 = std::operator<<((ostream *)&std::cout,"stopped after: ");
  lVar12 = *(long *)poVar5;
  lVar2 = *(long *)(lVar12 + -0x18);
  *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(poVar5 + *(long *)(lVar12 + -0x18) + 8) = 2;
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(double)lVar6 / 1000000000.0);
  std::operator<<(poVar5,"s\n");
  pcVar13 = "UNKNOWN\n";
  std::operator<<((ostream *)&std::cout,"UNKNOWN\n");
  uVar15 = 1;
  _Exit(1);
  puStack_48 = &std::cout;
  dStack_520 = (double)CONCAT44(dStack_520._4_4_,uVar15);
  ppcStack_518 = (char **)pcVar13;
  signal(2,signalHandler);
  signal(0xf,signalHandler);
  std::__cxx11::string::string
            ((string *)&sStack_3b8,"SAT solver for propositional logic",(allocator *)asStack_4d0);
  Utils::ArgumentParser::ArgumentParser(&AStack_1b0,&sStack_3b8,&program_description_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_3b8);
  std::__cxx11::string::string((string *)&sStack_3b8,"input",(allocator *)&sStack_5a8);
  std::__cxx11::string::string
            ((string *)asStack_4d0,"input file (in DIMACS format). If not specified, use stdin",
             (allocator *)&sStack_588);
  pAVar7 = Utils::ArgumentParser::make_positional<std::__cxx11::string>
                     (&AStack_1b0,&sStack_3b8,asStack_4d0);
  std::__cxx11::string::~string((string *)asStack_4d0);
  std::__cxx11::string::~string((string *)&sStack_3b8);
  std::__cxx11::string::string((string *)asStack_4d0,"help",(allocator *)&bStack_550);
  std::__cxx11::string::string
            ((string *)&sStack_5a8,"print this message and exit",(allocator *)&vStack_568);
  std::__cxx11::string::string((string *)&sStack_3b8,"h",&aStack_5ab);
  std::__cxx11::string::string(asStack_398,"help",&aStack_5ac);
  __l._M_len = 2;
  __l._M_array = &sStack_3b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&sStack_588,__l,&aStack_5aa);
  pAStack_528 = Utils::ArgumentParser::make_flag
                          (&AStack_1b0,asStack_4d0,&sStack_5a8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&sStack_588);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&sStack_588);
  lVar12 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&sStack_3b8._M_dataplus._M_p + lVar12));
    lVar12 = lVar12 + -0x20;
  } while (lVar12 != -0x20);
  std::__cxx11::string::~string((string *)&sStack_5a8);
  std::__cxx11::string::~string((string *)asStack_4d0);
  std::__cxx11::string::string((string *)asStack_4d0,"verbose",(allocator *)&bStack_550);
  std::__cxx11::string::string
            ((string *)&sStack_5a8,
             "print the resolution process step by step.\nWARNING: can be really expansive",
             (allocator *)&vStack_568);
  std::__cxx11::string::string((string *)&sStack_3b8,"v",&aStack_5ab);
  std::__cxx11::string::string(asStack_398,"verbose",&aStack_5ac);
  __l_00._M_len = 2;
  __l_00._M_array = &sStack_3b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&sStack_588,__l_00,&aStack_5aa);
  pAStack_4d8 = Utils::ArgumentParser::make_flag
                          (&AStack_1b0,asStack_4d0,&sStack_5a8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&sStack_588);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&sStack_588);
  lVar12 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&sStack_3b8._M_dataplus._M_p + lVar12));
    lVar12 = lVar12 + -0x20;
  } while (lVar12 != -0x20);
  std::__cxx11::string::~string((string *)&sStack_5a8);
  std::__cxx11::string::~string((string *)asStack_4d0);
  std::__cxx11::string::string((string *)asStack_4d0,"print_proof",(allocator *)&bStack_550);
  std::__cxx11::string::string
            ((string *)&sStack_5a8,"print proof (both for sat and unsat)",(allocator *)&vStack_568);
  std::__cxx11::string::string((string *)&sStack_3b8,"p",&aStack_5ab);
  std::__cxx11::string::string(asStack_398,"proof",&aStack_5ac);
  __l_01._M_len = 2;
  __l_01._M_array = &sStack_3b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&sStack_588,__l_01,&aStack_5aa);
  pAStack_4e0 = Utils::ArgumentParser::make_flag
                          (&AStack_1b0,asStack_4d0,&sStack_5a8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&sStack_588);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&sStack_588);
  lVar12 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&sStack_3b8._M_dataplus._M_p + lVar12));
    lVar12 = lVar12 + -0x20;
  } while (lVar12 != -0x20);
  std::__cxx11::string::~string((string *)&sStack_5a8);
  std::__cxx11::string::~string((string *)asStack_4d0);
  std::__cxx11::string::string((string *)&sStack_3b8,"no_preprocessing",(allocator *)&bStack_550);
  std::__cxx11::string::string
            ((string *)asStack_4d0,"disable preprocessing of clause",(allocator *)&vStack_568);
  std::__cxx11::string::string((string *)&sStack_5a8,"no-preprocessing",&aStack_5ab);
  __l_02._M_len = 1;
  __l_02._M_array = &sStack_5a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&sStack_588,__l_02,(allocator_type *)&aStack_5ac);
  pAVar8 = Utils::ArgumentParser::make_flag
                     (&AStack_1b0,&sStack_3b8,asStack_4d0,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&sStack_588);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&sStack_588);
  std::__cxx11::string::~string((string *)&sStack_5a8);
  std::__cxx11::string::~string((string *)asStack_4d0);
  std::__cxx11::string::~string((string *)&sStack_3b8);
  std::__cxx11::string::string((string *)&sStack_3b8,"no_restart",(allocator *)&bStack_550);
  std::__cxx11::string::string
            ((string *)asStack_4d0,"disable search restart",(allocator *)&vStack_568);
  std::__cxx11::string::string((string *)&sStack_5a8,"no-restart",&aStack_5ab);
  __l_03._M_len = 1;
  __l_03._M_array = &sStack_5a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&sStack_588,__l_03,(allocator_type *)&aStack_5ac);
  pAStack_4e8 = Utils::ArgumentParser::make_flag
                          (&AStack_1b0,&sStack_3b8,asStack_4d0,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&sStack_588);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&sStack_588);
  std::__cxx11::string::~string((string *)&sStack_5a8);
  std::__cxx11::string::~string((string *)asStack_4d0);
  std::__cxx11::string::~string((string *)&sStack_3b8);
  std::__cxx11::string::string((string *)&sStack_3b8,"no_deletion",(allocator *)&bStack_550);
  std::__cxx11::string::string
            ((string *)asStack_4d0,"disable deletion of learned clauses",(allocator *)&vStack_568);
  std::__cxx11::string::string((string *)&sStack_5a8,"no-deletion",&aStack_5ab);
  __l_04._M_len = 1;
  __l_04._M_array = &sStack_5a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&sStack_588,__l_04,(allocator_type *)&aStack_5ac);
  pAStack_4f0 = Utils::ArgumentParser::make_flag
                          (&AStack_1b0,&sStack_3b8,asStack_4d0,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&sStack_588);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&sStack_588);
  std::__cxx11::string::~string((string *)&sStack_5a8);
  std::__cxx11::string::~string((string *)asStack_4d0);
  std::__cxx11::string::~string((string *)&sStack_3b8);
  std::__cxx11::string::string((string *)&sStack_3b8,"no_random_choice",(allocator *)&bStack_550);
  std::__cxx11::string::string
            ((string *)asStack_4d0,"disable random selection of literal in 1% of the cases",
             (allocator *)&vStack_568);
  std::__cxx11::string::string((string *)&sStack_5a8,"no-random",&aStack_5ab);
  __l_05._M_len = 1;
  __l_05._M_array = &sStack_5a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&sStack_588,__l_05,(allocator_type *)&aStack_5ac);
  pAStack_4f8 = Utils::ArgumentParser::make_flag
                          (&AStack_1b0,&sStack_3b8,asStack_4d0,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&sStack_588);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&sStack_588);
  std::__cxx11::string::~string((string *)&sStack_5a8);
  std::__cxx11::string::~string((string *)asStack_4d0);
  std::__cxx11::string::~string((string *)&sStack_3b8);
  std::__cxx11::string::string((string *)&sStack_3b8,"no_cc_reduction",(allocator *)&bStack_550);
  std::__cxx11::string::string
            ((string *)asStack_4d0,"disable reduction of the conflict clause",
             (allocator *)&vStack_568);
  std::__cxx11::string::string((string *)&sStack_5a8,"no-cc-reduction",&aStack_5ab);
  __l_06._M_len = 1;
  __l_06._M_array = &sStack_5a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&sStack_588,__l_06,(allocator_type *)&aStack_5ac);
  pAStack_500 = Utils::ArgumentParser::make_flag
                          (&AStack_1b0,&sStack_3b8,asStack_4d0,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&sStack_588);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&sStack_588);
  std::__cxx11::string::~string((string *)&sStack_5a8);
  std::__cxx11::string::~string((string *)asStack_4d0);
  std::__cxx11::string::~string((string *)&sStack_3b8);
  std::__cxx11::string::string((string *)&sStack_3b8,"clause decay",&aStack_5ab);
  std::__cxx11::to_string(&sStack_588,0.999);
  std::operator+(&sStack_5a8,anon_var_dwarf_c33a,&sStack_588);
  std::operator+(asStack_4d0,&sStack_5a8,")");
  std::__cxx11::string::string((string *)&bStack_550,"c-decay",&aStack_5ac);
  __l_07._M_len = 1;
  __l_07._M_array = &bStack_550;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_568,__l_07,&aStack_5aa);
  pAStack_530 = Utils::ArgumentParser::make_option<float>
                          (&AStack_1b0,&sStack_3b8,asStack_4d0,&vStack_568);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_568);
  std::__cxx11::string::~string((string *)&bStack_550);
  std::__cxx11::string::~string((string *)asStack_4d0);
  std::__cxx11::string::~string((string *)&sStack_5a8);
  std::__cxx11::string::~string((string *)&sStack_588);
  std::__cxx11::string::~string((string *)&sStack_3b8);
  std::__cxx11::string::string((string *)&sStack_3b8,"literal decay",&aStack_5ab);
  std::__cxx11::to_string(&sStack_588,0.95);
  std::operator+(&sStack_5a8,anon_var_dwarf_c382,&sStack_588);
  std::operator+(asStack_4d0,&sStack_5a8,")");
  std::__cxx11::string::string((string *)&bStack_550,"l-decay",&aStack_5ac);
  __l_08._M_len = 1;
  __l_08._M_array = &bStack_550;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_568,__l_08,&aStack_5aa);
  pAStack_510 = Utils::ArgumentParser::make_option<float>
                          (&AStack_1b0,&sStack_3b8,asStack_4d0,&vStack_568);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_568);
  std::__cxx11::string::~string((string *)&bStack_550);
  std::__cxx11::string::~string((string *)asStack_4d0);
  std::__cxx11::string::~string((string *)&sStack_5a8);
  std::__cxx11::string::~string((string *)&sStack_588);
  std::__cxx11::string::~string((string *)&sStack_3b8);
  std::__cxx11::string::string((string *)asStack_4d0,"restart multiplier",&aStack_5ab);
  b = 100;
  std::__cxx11::to_string(&bStack_550,100);
  std::operator+(&sStack_588,"restarting sequence multiplicator (default ",&bStack_550);
  std::operator+(&sStack_5a8,&sStack_588,")");
  std::__cxx11::string::string((string *)&sStack_3b8,"b",&aStack_5ac);
  std::__cxx11::string::string(asStack_398,"restart-mult",(allocator *)&aStack_5aa);
  __l_09._M_len = 2;
  __l_09._M_array = &sStack_3b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_568,__l_09,&aStack_5a9);
  pAStack_508 = pAVar8;
  pAVar9 = Utils::ArgumentParser::make_option<unsigned_int>
                     (&AStack_1b0,asStack_4d0,&sStack_5a8,&vStack_568);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_568);
  lVar12 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&sStack_3b8._M_dataplus._M_p + lVar12));
    lVar12 = lVar12 + -0x20;
  } while (lVar12 != -0x20);
  std::__cxx11::string::~string((string *)&sStack_5a8);
  std::__cxx11::string::~string((string *)&sStack_588);
  std::__cxx11::string::~string((string *)&bStack_550);
  std::__cxx11::string::~string((string *)asStack_4d0);
  std::__cxx11::string::string((string *)asStack_4d0,"learn multiplier",&aStack_5ab);
  std::__cxx11::to_string(&bStack_550,0.5);
  std::operator+(&sStack_588,
                 "initial learn limit, is a multiple of the clauses in  the formula (default ",
                 &bStack_550);
  std::operator+(&sStack_5a8,&sStack_588,"x)");
  std::__cxx11::string::string((string *)&sStack_3b8,"l",&aStack_5ac);
  std::__cxx11::string::string(asStack_398,"learn-mult",(allocator *)&aStack_5aa);
  __l_10._M_len = 2;
  __l_10._M_array = &sStack_3b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_568,__l_10,&aStack_5a9);
  pAVar10 = Utils::ArgumentParser::make_option<float>
                      (&AStack_1b0,asStack_4d0,&sStack_5a8,&vStack_568);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_568);
  lVar12 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&sStack_3b8._M_dataplus._M_p + lVar12));
    lVar12 = lVar12 + -0x20;
  } while (lVar12 != -0x20);
  std::__cxx11::string::~string((string *)&sStack_5a8);
  std::__cxx11::string::~string((string *)&sStack_588);
  std::__cxx11::string::~string((string *)&bStack_550);
  std::__cxx11::string::~string((string *)asStack_4d0);
  std::__cxx11::string::string((string *)asStack_4d0,"learn increase",&aStack_5ab);
  std::__cxx11::to_string(&bStack_550,10.0);
  std::operator+(&sStack_588,
                 "when the learn limit is reached, some learned clauses are eliminated and the learn limit is increased by this percentage (default "
                 ,&bStack_550);
  std::operator+(&sStack_5a8,&sStack_588,"%)");
  std::__cxx11::string::string((string *)&sStack_3b8,"i",&aStack_5ac);
  std::__cxx11::string::string(asStack_398,"learn-increase",(allocator *)&aStack_5aa);
  __l_11._M_len = 2;
  __l_11._M_array = &sStack_3b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_568,__l_11,&aStack_5a9);
  pAVar11 = Utils::ArgumentParser::make_option<float>
                      (&AStack_1b0,asStack_4d0,&sStack_5a8,&vStack_568);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_568);
  lVar12 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&sStack_3b8._M_dataplus._M_p + lVar12));
    lVar12 = lVar12 + -0x20;
  } while (lVar12 != -0x20);
  std::__cxx11::string::~string((string *)&sStack_5a8);
  std::__cxx11::string::~string((string *)&sStack_588);
  std::__cxx11::string::~string((string *)&bStack_550);
  std::__cxx11::string::~string((string *)asStack_4d0);
  Utils::ArgumentParser::parseCLI(&AStack_1b0,dStack_520._0_4_,ppcStack_518);
  if ((pAStack_528->super_ArgObject).parsed == true) {
    Utils::operator<<((ostream *)&std::cout,&AStack_1b0);
  }
  else {
    std::ifstream::ifstream(&sStack_3b8);
    std::istream::istream(asStack_4d0,(streambuf *)0x0);
    if ((pAVar7->
        super_TypedArgObj<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).super_ValueArgObj.super_ArgObject.parsed == true) {
      pbVar14 = &(pAVar7->
                 super_TypedArgObj<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).value;
      std::ifstream::open((string *)&sStack_3b8,(_Ios_Openmode)pbVar14);
      if (*(int *)(asStack_398 + *(long *)(sStack_3b8._M_dataplus._M_p + -0x18)) != 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"ERROR: file ");
        poVar5 = std::operator<<(poVar5,(string *)pbVar14);
        std::operator<<(poVar5," doesn\'t exist\n");
        exit(0);
      }
      std::ios::rdbuf((streambuf *)
                      ((long)&asStack_4d0[0]._M_dataplus._M_p +
                      *(long *)(asStack_4d0[0]._M_dataplus._M_p + -0x18)));
    }
    else {
      std::ios::rdbuf((streambuf *)
                      ((long)&asStack_4d0[0]._M_dataplus._M_p +
                      *(long *)(asStack_4d0[0]._M_dataplus._M_p + -0x18)));
    }
    if ((pAStack_530->super_TypedArgObj<float>).field_0x48 == '\x01') {
      fVar1 = (pAStack_530->super_TypedArgObj<float>).value;
      if ((fVar1 <= 0.0) || (1.0 < fVar1)) {
        poVar5 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_c480);
        Utils::operator<<(poVar5,&AStack_1b0);
        goto LAB_0010e9d5;
      }
      ppcStack_518 = (char **)(double)fVar1;
    }
    else {
      ppcStack_518 = (char **)0x3feff7cee0000000;
    }
    if ((pAStack_510->super_TypedArgObj<float>).field_0x48 == '\x01') {
      fVar1 = (pAStack_510->super_TypedArgObj<float>).value;
      if ((fVar1 <= 0.0) || (1.0 < fVar1)) {
        poVar5 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_c499);
        Utils::operator<<(poVar5,&AStack_1b0);
        goto LAB_0010e9d5;
      }
      dStack_520 = (double)fVar1;
    }
    else {
      dStack_520 = 0.949999988079071;
    }
    if (((pAVar9->super_TypedArgObj<unsigned_int>).field_0x48 == '\x01') &&
       (b = (pAVar9->super_TypedArgObj<unsigned_int>).value, b == 0)) {
      poVar5 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_c4a4);
      Utils::operator<<(poVar5,&AStack_1b0);
LAB_0010e9d5:
      exit(1);
    }
    if ((pAVar10->super_TypedArgObj<float>).field_0x48 == '\x01') {
      fVar1 = (pAVar10->super_TypedArgObj<float>).value;
      if (fVar1 <= 0.0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"ERROR: should be learn-mult > 0.0\n");
        Utils::operator<<(poVar5,&AStack_1b0);
        goto LAB_0010e9d5;
      }
      pAStack_528 = (ArgFlag *)(double)fVar1;
    }
    else {
      pAStack_528 = (ArgFlag *)0x3fe0000000000000;
    }
    if ((pAVar11->super_TypedArgObj<float>).field_0x48 == '\x01') {
      fVar1 = (pAVar11->super_TypedArgObj<float>).value;
      if (fVar1 < 0.0) {
        poVar5 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_c4c8);
        Utils::operator<<(poVar5,&AStack_1b0);
        goto LAB_0010e9d5;
      }
      pAStack_530 = (ArgOption<float> *)(double)fVar1;
    }
    else {
      pAStack_530 = (ArgOption<float> *)0x4024000000000000;
    }
    Satyricon::SATSolver::set_log(&solver,(pAStack_4d8->super_ArgObject).parsed + 1);
    start.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    bVar4 = Satyricon::parse_file(&solver,(istream *)asStack_4d0);
    lVar6 = std::chrono::_V2::steady_clock::now();
    tVar3 = start;
    poVar5 = std::operator<<((ostream *)&std::cout,"read file and initialized solver in: ");
    lVar12 = *(long *)poVar5;
    lVar2 = *(long *)(lVar12 + -0x18);
    *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xfffffefb | 4;
    *(undefined8 *)(poVar5 + *(long *)(lVar12 + -0x18) + 8) = 2;
    poVar5 = (ostream *)
             std::ostream::operator<<(poVar5,(float)(lVar6 - (long)tVar3.__d.__r) / 1e+09);
    std::operator<<(poVar5,"s\n");
    if (bVar4) {
      std::operator<<((ostream *)&std::cout,"found a conflict during solver construction\n");
      poVar5 = std::operator<<((ostream *)&std::cout,"UNSATISFIABLE");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    else {
      if ((pAStack_508->super_ArgObject).parsed == true) {
        Satyricon::SATSolver::set_preprocessing(&solver,false);
      }
      if ((pAStack_4e8->super_ArgObject).parsed == true) {
        Satyricon::SATSolver::set_restart(&solver,false);
      }
      if ((pAStack_4f0->super_ArgObject).parsed == true) {
        Satyricon::SATSolver::set_deletion(&solver,false);
      }
      if ((pAStack_4f8->super_ArgObject).parsed == true) {
        Satyricon::SATSolver::set_random_choice(&solver,false);
      }
      if ((pAStack_500->super_ArgObject).parsed == true) {
        Satyricon::SATSolver::set_conflict_clause_reduction(&solver,false);
      }
      Satyricon::SATSolver::set_clause_decay(&solver,(double)ppcStack_518);
      Satyricon::SATSolver::set_literal_decay(&solver,dStack_520);
      Satyricon::SATSolver::set_learning_multiplier(&solver,(double)pAStack_528);
      Satyricon::SATSolver::set_learning_increase(&solver,(double)pAStack_530);
      Satyricon::SATSolver::set_restarting_multiplier(&solver,b);
      bVar4 = Satyricon::SATSolver::solve(&solver);
      lVar6 = std::chrono::_V2::steady_clock::now();
      tVar3 = start;
      poVar5 = std::operator<<((ostream *)&std::cout,"completed in: ");
      lVar12 = *(long *)poVar5;
      lVar2 = *(long *)(lVar12 + -0x18);
      *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar5 + *(long *)(lVar12 + -0x18) + 8) = 2;
      poVar5 = std::ostream::_M_insert<double>((double)(lVar6 - (long)tVar3.__d.__r) / 1000000000.0)
      ;
      std::operator<<(poVar5,"s\n");
      pcVar13 = "UNSATISFIABLE";
      if (bVar4) {
        pcVar13 = "SATISFIABLE";
      }
      poVar5 = std::operator<<((ostream *)&std::cout,pcVar13);
      std::endl<char,std::char_traits<char>>(poVar5);
      if ((bVar4 & (pAStack_4e0->super_ArgObject).parsed) == 1) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Model: ");
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        Satyricon::SATSolver::string_model_abi_cxx11_(&sStack_5a8,&solver);
        poVar5 = std::operator<<(poVar5,(string *)&sStack_5a8);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::string::~string((string *)&sStack_5a8);
      }
    }
    std::istream::~istream(asStack_4d0);
    std::ifstream::~ifstream(&sStack_3b8);
  }
  Utils::ArgumentParser::~ArgumentParser(&AStack_1b0);
  return;
}

Assistant:

void signalHandler( int signum ) {
    //TODO: print solver status
    cout << "Interrupt signal (" << signum << ") received.\n";

    auto end_time = std::chrono::steady_clock::now();
    std::chrono::duration<double> elapsed = end_time - start;
    cout << "stopped after: " << std::fixed << std::setprecision(2) <<
        elapsed.count() << "s\n";

    cout << "UNKNOWN\n";
    std::_Exit(1); // quick exit
}